

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

int Sfm_LibImplementSimple
              (Sfm_Lib_t *p,word *pTruth,int *pFanins,int nFanins,Vec_Int_t *vGates,
              Vec_Wec_t *vFanins)

{
  uint nWords;
  int iVar1;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar2;
  Vec_Int_t *p_00;
  int nWords_00;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  nWords = p->nWords;
  iVar1 = Abc_TtIsConst0(pTruth,nWords);
  if ((iVar1 != 0) || (iVar1 = Abc_TtIsConst1(pTruth,nWords), iVar1 != 0)) {
    if (nFanins == 0) {
      iVar1 = Abc_TtIsConst1(pTruth,nWords);
      if (iVar1 == 0) {
        pMVar2 = Mio_LibraryReadConst0(pLib);
      }
      else {
        pMVar2 = Mio_LibraryReadConst1(pLib);
      }
      iVar1 = Mio_GateReadValue(pMVar2);
      Vec_IntPush(vGates,iVar1);
      Vec_WecPushLevel(vFanins);
      return 1;
    }
    __assert_fail("nFanins == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x2ae,
                  "int Sfm_LibImplementSimple(Sfm_Lib_t *, word *, int *, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  iVar1 = Abc_TtEqual(pTruth,s_Truth8[0],nWords);
  if (iVar1 == 0) {
    iVar1 = Abc_TtOpposite(pTruth,(word *)(ulong)nWords,nWords_00);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x2bd,
                    "int Sfm_LibImplementSimple(Sfm_Lib_t *, word *, int *, int, Vec_Int_t *, Vec_Wec_t *)"
                   );
    }
    if (nFanins != 1) goto LAB_0044c45f;
    pMVar2 = Mio_LibraryReadInv(pLib);
  }
  else {
    if (nFanins != 1) {
LAB_0044c45f:
      __assert_fail("nFanins == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x2b6,
                    "int Sfm_LibImplementSimple(Sfm_Lib_t *, word *, int *, int, Vec_Int_t *, Vec_Wec_t *)"
                   );
    }
    pMVar2 = Mio_LibraryReadBuf(pLib);
  }
  iVar1 = Mio_GateReadValue(pMVar2);
  Vec_IntPush(vGates,iVar1);
  p_00 = Vec_WecPushLevel(vFanins);
  Vec_IntPush(p_00,*pFanins);
  return 1;
}

Assistant:

int Sfm_LibImplementSimple( Sfm_Lib_t * p, word * pTruth, int * pFanins, int nFanins, Vec_Int_t * vGates, Vec_Wec_t * vFanins )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Mio_Gate_t * pGate;
    Vec_Int_t * vLevel;
    if ( Abc_TtIsConst0(pTruth, p->nWords) || Abc_TtIsConst1(pTruth, p->nWords) )
    {
        assert( nFanins == 0 );
        pGate = Abc_TtIsConst1(pTruth, p->nWords) ? Mio_LibraryReadConst1(pLib) : Mio_LibraryReadConst0(pLib);
        Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
        vLevel = Vec_WecPushLevel( vFanins );
        return 1;
    }
    if ( Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) || Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords) )
    {
        assert( nFanins == 1 );
        pGate = Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) ? Mio_LibraryReadBuf(pLib) : Mio_LibraryReadInv(pLib);
        Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
        vLevel = Vec_WecPushLevel( vFanins );
        Vec_IntPush( vLevel, pFanins[0] );
        return 1;
    }
    assert( 0 );
    return -1;
}